

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O2

void nn_ins_connect(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_list_item *it;
  nn_ins_item *it_00;
  nn_ins_item *pnVar2;
  char *__s1;
  char *__s2;
  
  nn_mutex_lock(&self.sync);
  it = nn_list_end(&self.connected);
  nn_list_insert(&self.connected,&item->item,it);
  it_00 = (nn_ins_item *)nn_list_begin(&self.bound);
  do {
    pnVar2 = (nn_ins_item *)nn_list_end(&self.bound);
    if (it_00 == pnVar2) {
LAB_001ab43c:
      nn_mutex_unlock(&self.sync);
      return;
    }
    __s1 = nn_ep_getaddr(item->ep);
    __s2 = nn_ep_getaddr(it_00->ep);
    iVar1 = strncmp(__s1,__s2,0x80);
    if (iVar1 == 0) {
      iVar1 = nn_ep_ispeer_ep(item->ep,it_00->ep);
      if (iVar1 != 0) {
        (*fn)(item,it_00);
      }
      goto LAB_001ab43c;
    }
    it_00 = (nn_ins_item *)nn_list_next(&self.bound,&it_00->item);
  } while( true );
}

Assistant:

void nn_ins_connect (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;

    nn_mutex_lock (&self.sync);

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.connected, &item->item,
        nn_list_end (&self.connected));

    /*  During this process a pipe may be created. */
    for (it = nn_list_begin (&self.bound);
          it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);

        if (strncmp (nn_ep_getaddr(item->ep), nn_ep_getaddr(bitem->ep),
            NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_ep_ispeer_ep (item->ep, bitem->ep))
                break;

            /*  Call back to cinproc to create actual connection. */
            fn (item, bitem);

            break;
        }
    }

    nn_mutex_unlock (&self.sync);
}